

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_sock.c
# Opt level: O0

int BIO_get_accept_socket(char *host_port,int mode)

{
  int iVar1;
  int iVar2;
  int options;
  BIO_ADDRINFO *res;
  char *p;
  char *h;
  int s;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  BIO_ADDRINFO *bai;
  char *service;
  char *host;
  int iVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar3 = -1;
  host = (char *)0x0;
  service = (char *)0x0;
  bai = (BIO_ADDRINFO *)0x0;
  iVar1 = BIO_parse_hostserv((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (char **)host_port,(char **)CONCAT44(mode,0xffffffff),
                             BIO_PARSE_PRIO_HOST);
  if (iVar1 == 0) {
    iVar3 = -1;
  }
  else {
    iVar1 = BIO_sock_init();
    if (iVar1 == 1) {
      iVar1 = BIO_lookup(host,service,(BIO_lookup_type)((ulong)bai >> 0x20),(int)bai,
                         in_stack_ffffffffffffffcc,
                         (BIO_ADDRINFO **)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (iVar1 == 0) {
        iVar1 = BIO_ADDRINFO_family(bai);
        iVar2 = BIO_ADDRINFO_socktype(bai);
        BIO_ADDRINFO_protocol(bai);
        options = BIO_socket(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                             in_stack_ffffffffffffffb8,0);
        if (options == -1) {
          iVar3 = -1;
        }
        else {
          iVar3 = options;
          BIO_ADDRINFO_address(bai);
          iVar1 = BIO_listen((int)bai,(BIO_ADDR *)CONCAT44(iVar2,iVar1),options);
          in_stack_ffffffffffffffc4 = options;
          if (iVar1 == 0) {
            BIO_closesocket(0x21d2a2);
            iVar3 = -1;
            in_stack_ffffffffffffffc4 = options;
          }
        }
      }
      BIO_ADDRINFO_free((BIO_ADDRINFO *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      CRYPTO_free(host);
      CRYPTO_free(service);
    }
    else {
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int BIO_get_accept_socket(char *host, int bind_mode)
{
    int s = INVALID_SOCKET;
    char *h = NULL, *p = NULL;
    BIO_ADDRINFO *res = NULL;

    if (!BIO_parse_hostserv(host, &h, &p, BIO_PARSE_PRIO_SERV))
        return INVALID_SOCKET;

    if (BIO_sock_init() != 1)
        return INVALID_SOCKET;

    if (BIO_lookup(h, p, BIO_LOOKUP_SERVER, AF_UNSPEC, SOCK_STREAM, &res) != 0)
        goto err;

    if ((s = BIO_socket(BIO_ADDRINFO_family(res), BIO_ADDRINFO_socktype(res),
                        BIO_ADDRINFO_protocol(res), 0)) == INVALID_SOCKET) {
        s = INVALID_SOCKET;
        goto err;
    }

    if (!BIO_listen(s, BIO_ADDRINFO_address(res),
                    bind_mode ? BIO_SOCK_REUSEADDR : 0)) {
        BIO_closesocket(s);
        s = INVALID_SOCKET;
    }

 err:
    BIO_ADDRINFO_free(res);
    OPENSSL_free(h);
    OPENSSL_free(p);

    return s;
}